

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O1

void __thiscall ConfidentialTxIn_SetIssuance_Test::TestBody(ConfidentialTxIn_SetIssuance_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  AssertHelperData *pAVar3;
  undefined8 uVar4;
  bool bVar5;
  uint32_t uVar6;
  pointer pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__dest;
  ulong uVar8;
  size_t sVar9;
  char *pcVar10;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar;
  ConfidentialTxIn txin;
  undefined1 local_218 [32];
  internal local_1f8 [8];
  _Alloc_hider local_1f0;
  string local_1e8;
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [2];
  ConfidentialTxIn local_188;
  
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_188,&exp_txid,2,0xfffffffe,&exp_script);
  bVar5 = testing::internal::AlwaysTrue();
  if (bVar5) {
    bVar5 = testing::internal::AlwaysTrue();
    if (bVar5) {
      cfd::core::ConfidentialTxIn::SetIssuance
                (&local_188,&exp_blinding_nonce,&exp_asset_entropy,&exp_issuance_amount,
                 &exp_inflation_keys,&exp_issuance_amount_rangeproof,&exp_inflation_keys_rangeproof)
      ;
    }
  }
  else {
    testing::Message::Message((Message *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x8d,
               "Expected: (txin.SetIssuance(exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  local_218._0_4_ = cfd::core::AbstractTxIn::GetVout(&local_188.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_1c0,"txin.GetVout()","exp_index",(uint *)local_218,&exp_index);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if ((pointer)local_1c0._8_8_ == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x8f,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if ((AssertHelperData *)local_218._0_8_ != (AssertHelperData *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((AssertHelperData *)local_218._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_218._0_8_ + 8))();
      }
      local_218._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1c0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar6 = cfd::core::AbstractTxIn::GetSequence(&local_188.super_AbstractTxIn);
  local_218._0_4_ = uVar6;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_1c0,"txin.GetSequence()","exp_sequence",(uint *)local_218,
             &exp_sequence);
  if (local_1c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_218);
    if ((pointer)local_1c0._8_8_ == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1c0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x90,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
    if ((AssertHelperData *)local_218._0_8_ != (AssertHelperData *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((AssertHelperData *)local_218._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_218._0_8_ + 8))();
      }
      local_218._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1c0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::AbstractTxIn::GetTxid((Txid *)local_218,&local_188.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_1c0,(Txid *)local_218);
  uVar4 = local_1c0._0_8_;
  cfd::core::Txid::GetHex_abi_cxx11_(&local_1e8,&exp_txid);
  testing::internal::CmpHelperSTREQ
            (local_1f8,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",(char *)uVar4,
             local_1e8._M_dataplus._M_p);
  paVar1 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_1c0 + 0x10);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_ !=
      pbVar2) {
    operator_delete((void *)local_1c0._0_8_,local_1b0[0]._M_allocated_capacity + 1);
  }
  local_218._0_8_ = &PTR__Txid_007e3348;
  if ((pointer)local_218._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._8_8_,local_218._24_8_ - local_218._8_8_);
  }
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c0);
    if (local_1f0._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x91,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetUnlockingScript((Script *)local_1c0,&local_188.super_AbstractTxIn);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_218,(Script *)local_1c0);
  uVar4 = local_218._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_(&local_1e8,&exp_script);
  testing::internal::CmpHelperSTREQ
            (local_1f8,"txin.GetUnlockingScript().GetHex().c_str()","exp_script.GetHex().c_str()",
             (char *)uVar4,local_1e8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (AssertHelperData *)(local_218 + 0x10);
  if ((AssertHelperData *)local_218._0_8_ != pAVar3) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  cfd::core::Script::~Script((Script *)local_1c0);
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c0);
    if (local_1f0._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x93,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  uVar8 = (long)local_188.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pcVar7 = (pointer)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar7 = (pointer)operator_new(uVar8);
  }
  local_1e8.field_2._M_allocated_capacity = (size_type)(pcVar7 + uVar8);
  sVar9 = (long)local_188.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1e8._M_dataplus._M_p = pcVar7;
  if (sVar9 != 0) {
    local_1e8._M_string_length = (size_type)pcVar7;
    memmove(pcVar7,local_188.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_1e8._M_string_length = (size_type)(pcVar7 + sVar9);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_1c0,(ByteData256 *)&local_1e8);
  uVar4 = local_1c0._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_218,&exp_blinding_nonce);
  testing::internal::CmpHelperSTREQ
            (local_1f8,"txin.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",(char *)uVar4,(char *)local_218._0_8_);
  if ((AssertHelperData *)local_218._0_8_ != pAVar3) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_ !=
      pbVar2) {
    operator_delete((void *)local_1c0._0_8_,local_1b0[0]._M_allocated_capacity + 1);
  }
  if (local_1e8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    local_1e8.field_2._M_allocated_capacity - (long)local_1e8._M_dataplus._M_p);
  }
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c0);
    if (local_1f0._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x95,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  uVar8 = (long)local_188.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(uVar8);
  }
  local_1e8.field_2._M_allocated_capacity = uVar8 + (long)__dest;
  sVar9 = (long)local_188.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1e8._M_dataplus._M_p = (pointer)__dest;
  if (sVar9 != 0) {
    local_1e8._M_string_length = (size_type)__dest;
    memmove(__dest,local_188.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_1e8._M_string_length = (long)__dest + sVar9;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_1c0,(ByteData256 *)&local_1e8);
  uVar4 = local_1c0._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_218,&exp_asset_entropy);
  testing::internal::CmpHelperSTREQ
            (local_1f8,"txin.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",(char *)uVar4,(char *)local_218._0_8_);
  if ((AssertHelperData *)local_218._0_8_ != pAVar3) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_ !=
      pbVar2) {
    operator_delete((void *)local_1c0._0_8_,local_1b0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    local_1e8.field_2._M_allocated_capacity - (long)local_1e8._M_dataplus._M_p);
  }
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c0);
    if (local_1f0._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x97,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_1c0,&local_188.issuance_amount_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_218,(ConfidentialValue *)local_1c0);
  uVar4 = local_218._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_1e8,&exp_issuance_amount);
  testing::internal::CmpHelperSTREQ
            (local_1f8,"txin.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",(char *)uVar4,local_1e8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_218._0_8_ != pAVar3) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  local_1c0._0_8_ = &PTR__ConfidentialValue_007f6a50;
  if ((pointer)local_1c0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ - local_1c0._8_8_);
  }
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c0);
    if (local_1f0._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x99,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_1c0,&local_188.inflation_keys_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_218,(ConfidentialValue *)local_1c0);
  uVar4 = local_218._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_1e8,&exp_inflation_keys);
  testing::internal::CmpHelperSTREQ
            (local_1f8,"txin.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",(char *)uVar4,local_1e8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_218._0_8_ != pAVar3) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  local_1c0._0_8_ = &PTR__ConfidentialValue_007f6a50;
  if ((pointer)local_1c0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ - local_1c0._8_8_);
  }
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c0);
    if (local_1f0._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x9b,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  uVar8 = (long)local_188.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pcVar7 = (pointer)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar7 = (pointer)operator_new(uVar8);
  }
  local_1e8.field_2._M_allocated_capacity = (size_type)(pcVar7 + uVar8);
  sVar9 = (long)local_188.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1e8._M_dataplus._M_p = pcVar7;
  if (sVar9 != 0) {
    local_1e8._M_string_length = (size_type)pcVar7;
    memmove(pcVar7,local_188.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_1e8._M_string_length = (size_type)(pcVar7 + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_1c0,(ByteData *)&local_1e8);
  uVar4 = local_1c0._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_218,&exp_issuance_amount_rangeproof);
  testing::internal::CmpHelperSTREQ
            (local_1f8,"txin.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",(char *)uVar4,(char *)local_218._0_8_
            );
  if ((AssertHelperData *)local_218._0_8_ != pAVar3) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_ !=
      pbVar2) {
    operator_delete((void *)local_1c0._0_8_,local_1b0[0]._M_allocated_capacity + 1);
  }
  if (local_1e8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    local_1e8.field_2._M_allocated_capacity - (long)local_1e8._M_dataplus._M_p);
  }
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c0);
    if (local_1f0._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x9d,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  uVar8 = (long)local_188.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pcVar7 = (pointer)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar7 = (pointer)operator_new(uVar8);
  }
  local_1e8.field_2._M_allocated_capacity = (size_type)(pcVar7 + uVar8);
  sVar9 = (long)local_188.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1e8._M_dataplus._M_p = pcVar7;
  if (sVar9 != 0) {
    local_1e8._M_string_length = (size_type)pcVar7;
    memmove(pcVar7,local_188.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_1e8._M_string_length = (size_type)(pcVar7 + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_1c0,(ByteData *)&local_1e8);
  uVar4 = local_1c0._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_218,&exp_inflation_keys_rangeproof);
  testing::internal::CmpHelperSTREQ
            (local_1f8,"txin.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",(char *)uVar4,(char *)local_218._0_8_)
  ;
  if ((AssertHelperData *)local_218._0_8_ != pAVar3) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_ !=
      pbVar2) {
    operator_delete((void *)local_1c0._0_8_,local_1b0[0]._M_allocated_capacity + 1);
  }
  if (local_1e8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    local_1e8.field_2._M_allocated_capacity - (long)local_1e8._M_dataplus._M_p);
  }
  if (local_1f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c0);
    if (local_1f0._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1f0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x9f,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxIn::GetWitnessHash((ByteData256 *)local_218,&local_188);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_1c0,(ByteData256 *)local_218);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1e8,"txin.GetWitnessHash().GetHex().c_str()",
             "\"66c6bd6d38aa080d0c840687accfcec970fa81cadebf94b379eda6a436f2a300\"",
             (char *)local_1c0._0_8_,
             "66c6bd6d38aa080d0c840687accfcec970fa81cadebf94b379eda6a436f2a300");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_ !=
      pbVar2) {
    operator_delete((void *)local_1c0._0_8_,local_1b0[0]._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_218._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
  }
  if ((char)local_1e8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_1c0);
    if ((pointer)local_1e8._M_string_length == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xa1,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_188);
  return;
}

Assistant:

TEST(ConfidentialTxIn, SetIssuance) {
  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script);
  EXPECT_NO_THROW((txin.SetIssuance(exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof)));

  EXPECT_EQ(txin.GetVout(), exp_index);
  EXPECT_EQ(txin.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
  EXPECT_STREQ(txin.GetBlindingNonce().GetHex().c_str(),
      exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin.GetAssetEntropy().GetHex().c_str(),
      exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmount().GetHex().c_str(),
      exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeys().GetHex().c_str(),
      exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmountRangeproof().GetHex().c_str(),
      exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeysRangeproof().GetHex().c_str(),
      exp_inflation_keys_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "66c6bd6d38aa080d0c840687accfcec970fa81cadebf94b379eda6a436f2a300");
}